

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainBuilder * __thiscall
kj::MainBuilder::expectZeroOrMoreArgs
          (MainBuilder *this,StringPtr title,
          Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback)

{
  bool bVar1;
  Impl *pIVar2;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *pFVar3;
  Arg local_68;
  Fault local_30;
  Fault f;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback_local;
  MainBuilder *this_local;
  StringPtr title_local;
  
  f.exception = (Exception *)callback;
  pIVar2 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  bVar1 = std::
          map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
          ::empty(&pIVar2->subCommands);
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x183,FAILED,"impl->subCommands.empty()",
               "\"cannot have sub-commands when expecting arguments\"",
               (char (*) [50])"cannot have sub-commands when expecting arguments");
    _::Debug::Fault::fatal(&local_30);
  }
  pIVar2 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  local_68.title.content.ptr = title.content.ptr;
  local_68.title.content.size_ = title.content.size_;
  pFVar3 = mv<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>(callback);
  Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Function(&local_68.callback,pFVar3);
  local_68.minCount = 0;
  local_68.maxCount = 0xffffffff;
  Vector<kj::MainBuilder::Impl::Arg>::add<kj::MainBuilder::Impl::Arg>(&pIVar2->args,&local_68);
  Impl::Arg::~Arg(&local_68);
  return this;
}

Assistant:

MainBuilder& MainBuilder::expectZeroOrMoreArgs(
    StringPtr title, Function<Validity(StringPtr)> callback) {
  KJ_REQUIRE(impl->subCommands.empty(), "cannot have sub-commands when expecting arguments");
  impl->args.add(Impl::Arg { title, kj::mv(callback), 0, UINT_MAX });
  return *this;
}